

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * __thiscall
cmGeneratorTarget::GetFilePrefixInternal
          (cmGeneratorTarget *this,ArtifactType artifact,string *language)

{
  cmMakefile *pcVar1;
  TargetType TVar2;
  char *pcVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  _Alloc_hider _Var10;
  ArtifactType artifact_00;
  bool bVar11;
  string langPrefix;
  size_type __dnew;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  undefined2 *local_70;
  undefined8 local_68;
  undefined2 local_60;
  undefined6 uStack_5e;
  string local_50;
  
  TVar2 = cmTarget::GetType(this->Target);
  if ((((TVar2 != STATIC_LIBRARY) &&
       (TVar2 = cmTarget::GetType(this->Target), TVar2 != SHARED_LIBRARY)) &&
      (TVar2 = cmTarget::GetType(this->Target), TVar2 != MODULE_LIBRARY)) &&
     (TVar2 = cmTarget::GetType(this->Target), TVar2 != EXECUTABLE)) {
    return (char *)0x0;
  }
  if (artifact == ImportLibraryArtifact) {
    pcVar1 = this->Makefile;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_b0._M_dataplus._M_p = (pointer)0x1b;
    local_90._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_b0);
    local_90.field_2._M_allocated_capacity = (size_type)local_b0._M_dataplus._M_p;
    builtin_strncpy(local_90._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
    local_90._M_string_length = (size_type)local_b0._M_dataplus._M_p;
    local_90._M_dataplus._M_p[(long)local_b0._M_dataplus._M_p] = '\0';
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_90);
    bVar11 = pcVar3 == (char *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,(ulong)(local_90.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    bVar11 = false;
  }
  if (bVar11) {
    return (char *)0x0;
  }
  TVar2 = cmTarget::GetType(this->Target);
  artifact_00 = artifact;
  if ((TVar2 != SHARED_LIBRARY) &&
     (TVar2 = cmTarget::GetType(this->Target), TVar2 != MODULE_LIBRARY)) {
    TVar2 = cmTarget::GetType(this->Target);
    artifact_00 = RuntimeBinaryArtifact;
    if (TVar2 == EXECUTABLE) {
      artifact_00 = artifact;
    }
  }
  if (artifact == ImportLibraryArtifact) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0.field_2._M_allocated_capacity._0_5_ = 0x524f504d49;
    local_b0.field_2._M_allocated_capacity._5_3_ = 0x505f54;
    local_b0.field_2._8_5_ = 0x5849464552;
    local_b0._M_string_length = 0xd;
    local_b0.field_2._M_local_buf[0xd] = '\0';
    pcVar3 = GetProperty(this,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_002ea160;
    lVar9 = CONCAT35(local_b0.field_2._M_allocated_capacity._5_3_,
                     local_b0.field_2._M_allocated_capacity._0_5_);
    _Var10._M_p = local_b0._M_dataplus._M_p;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity._0_4_ = 0x46455250;
    local_50.field_2._M_allocated_capacity._4_2_ = 0x5849;
    local_50._M_string_length = 6;
    local_50.field_2._M_local_buf[6] = '\0';
    pcVar3 = GetProperty(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002ea160;
    lVar9 = CONCAT17(local_50.field_2._M_local_buf[7],
                     CONCAT16(local_50.field_2._M_local_buf[6],
                              CONCAT24(local_50.field_2._M_allocated_capacity._4_2_,
                                       local_50.field_2._M_allocated_capacity._0_4_)));
    _Var10._M_p = local_50._M_dataplus._M_p;
  }
  operator_delete(_Var10._M_p,lVar9 + 1);
LAB_002ea160:
  if (pcVar3 != (char *)0x0) {
    return pcVar3;
  }
  pcVar3 = cmTarget::GetPrefixVariableInternal(this->Target,artifact_00);
  pcVar5 = (char *)0x0;
  if ((pcVar3 != (char *)0x0) && (language->_M_string_length != 0)) {
    if (*pcVar3 == '\0') {
      pcVar5 = (char *)0x0;
    }
    else {
      local_60 = 0x5f;
      local_68 = 1;
      local_70 = &local_60;
      strlen(pcVar3);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar3);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_c0 = *plVar7;
        lStack_b8 = plVar4[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar7;
        local_d0 = (long *)*plVar4;
      }
      local_c8 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d0,(ulong)(language->_M_dataplus)._M_p);
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0.field_2._8_8_ = plVar4[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_f0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT62(uStack_5e,local_60) + 1);
      }
      pcVar5 = cmMakefile::GetDefinition(this->Makefile,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (pcVar5 == (char *)0x0 && pcVar3 != (char *)0x0) {
    pcVar1 = this->Makefile;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    sVar6 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,pcVar3,pcVar3 + sVar6);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      return pcVar3;
    }
    return pcVar3;
  }
  return pcVar5;
}

Assistant:

const char* cmGeneratorTarget::GetFilePrefixInternal(
  cmStateEnums::ArtifactType artifact, const std::string& language) const
{
  // no prefix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty prefix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute prefix value.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));

  if (!targetPrefix) {
    const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
    if (!language.empty() && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + language;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }

    // if there is no prefix on the target nor specific language
    // use the cmake definition.
    if (!targetPrefix && prefixVar) {
      targetPrefix = this->Makefile->GetDefinition(prefixVar);
    }
  }

  return targetPrefix;
}